

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O3

RTMatrix4x4 * __thiscall
RTMatrix4x4::operator*(RTMatrix4x4 *__return_storage_ptr__,RTMatrix4x4 *this,RTMatrix4x4 *mat)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  long lVar22;
  
  RTMatrix4x4(__return_storage_ptr__);
  fVar6 = mat->m_data[0][0];
  fVar7 = mat->m_data[0][1];
  fVar8 = mat->m_data[0][2];
  fVar9 = mat->m_data[0][3];
  fVar10 = mat->m_data[1][0];
  fVar11 = mat->m_data[1][1];
  fVar12 = mat->m_data[1][2];
  fVar13 = mat->m_data[1][3];
  fVar14 = mat->m_data[2][0];
  fVar15 = mat->m_data[2][1];
  fVar16 = mat->m_data[2][2];
  fVar17 = mat->m_data[2][3];
  fVar18 = mat->m_data[3][0];
  fVar19 = mat->m_data[3][1];
  fVar20 = mat->m_data[3][2];
  fVar21 = mat->m_data[3][3];
  lVar22 = 0;
  do {
    fVar2 = *(float *)((long)this->m_data[0] + lVar22);
    fVar3 = *(float *)((long)this->m_data[0] + lVar22 + 4);
    fVar4 = *(float *)((long)this->m_data[0] + lVar22 + 8);
    fVar5 = *(float *)((long)this->m_data[0] + lVar22 + 0xc);
    pfVar1 = (float *)((long)__return_storage_ptr__->m_data[0] + lVar22);
    *pfVar1 = fVar5 * fVar18 + fVar4 * fVar14 + fVar2 * fVar6 + fVar3 * fVar10;
    pfVar1[1] = fVar5 * fVar19 + fVar4 * fVar15 + fVar2 * fVar7 + fVar3 * fVar11;
    pfVar1[2] = fVar5 * fVar20 + fVar4 * fVar16 + fVar2 * fVar8 + fVar3 * fVar12;
    pfVar1[3] = fVar5 * fVar21 + fVar4 * fVar17 + fVar2 * fVar9 + fVar3 * fVar13;
    lVar22 = lVar22 + 0x10;
  } while (lVar22 != 0x40);
  return __return_storage_ptr__;
}

Assistant:

const RTMatrix4x4 RTMatrix4x4::operator *(const RTMatrix4x4& mat) const
{
    RTMatrix4x4 res;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            res.m_data[row][col] =
                    m_data[row][0] * mat.m_data[0][col] +
                    m_data[row][1] * mat.m_data[1][col] +
                    m_data[row][2] * mat.m_data[2][col] +
                    m_data[row][3] * mat.m_data[3][col];

    return res;
}